

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::parse_some
          (basic_json_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  long *in_RDI;
  error_code ec;
  basic_json_visitor<char> *in_stack_ffffffffffffff98;
  basic_json_parser<char,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar4;
  undefined4 uStack_18;
  undefined4 uStack_14;
  
  std::error_code::error_code((error_code *)in_stack_ffffffffffffffa0);
  parse_some(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(error_code *)0x1bd486);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe0);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  iVar3 = in_stack_ffffffffffffffe0;
  uVar4 = in_stack_ffffffffffffffe4;
  (**(code **)(*in_RDI + 0x18))();
  ec_00._M_cat._0_4_ = iVar3;
  ec_00._0_8_ = in_stack_ffffffffffffffd8;
  ec_00._M_cat._4_4_ = uVar4;
  ser_error::ser_error
            ((ser_error *)CONCAT44(uStack_14,uStack_18),ec_00,
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffc0
            );
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void parse_some(basic_json_visitor<char_type>& visitor)
    {
        std::error_code ec;
        parse_some(visitor, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec,line_,column()));
        }
    }